

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O2

void roaring64_bitmap_add(roaring64_bitmap_t *r,uint64_t val)

{
  art_val_t *leaf;
  uint8_t high48 [6];
  uint local_20;
  ushort local_1c;
  
  local_20 = (uint)(byte)(val >> 0x38) | ((uint)(val >> 0x20) & 0xff0000) >> 8 |
             (uint)(val >> 0x18) & 0xff0000 | (uint)(val >> 8) & 0xff000000;
  local_1c = (ushort)(val >> 0x18) & 0xff | (ushort)(val >> 8) & 0xff00;
  leaf = art_find(&r->art,(art_key_chunk_t *)&local_20);
  containerptr_roaring64_bitmap_add(r,(uint8_t *)&local_20,(uint16_t)val,leaf);
  return;
}

Assistant:

void roaring64_bitmap_add(roaring64_bitmap_t *r, uint64_t val) {
    uint8_t high48[ART_KEY_BYTES];
    uint16_t low16 = split_key(val, high48);
    leaf_t *leaf = (leaf_t *)art_find(&r->art, high48);
    containerptr_roaring64_bitmap_add(r, high48, low16, leaf);
}